

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_motion.cxx
# Opt level: O2

void __thiscall xray_re::xr_motion::save(xr_motion *this,xr_writer *w)

{
  int32_t local_24;
  int32_t local_20;
  float local_1c;
  
  xr_writer::w_sz(w,&this->m_name);
  local_24 = this->m_frame_start;
  (*w->_vptr_xr_writer[2])(w,&local_24,4);
  local_20 = this->m_frame_end;
  (*w->_vptr_xr_writer[2])(w,&local_20,4);
  local_1c = this->m_fps;
  (*w->_vptr_xr_writer[2])(w,&local_1c,4);
  return;
}

Assistant:

void xr_motion::save(xr_writer& w) const
{
	w.w_sz(m_name);
	w.w_s32(m_frame_start);
	w.w_s32(m_frame_end);
	w.w_float(m_fps);
}